

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_coin_selection.cpp
# Opt level: O2

void __thiscall
CoinSelection_SelectCoins_SelectCoinsBnB_empty_with_asset_Test::TestBody
          (CoinSelection_SelectCoins_SelectCoinsBnB_empty_with_asset_Test *this)

{
  mapped_type_conflict mVar1;
  uint32_t vout;
  pointer pTVar2;
  bool bVar3;
  mapped_type *pmVar4;
  mapped_type_conflict *pmVar5;
  char *pcVar6;
  CoinSelectionOption *in_R9;
  pointer utxo;
  pointer hex;
  Amount AVar7;
  AssertHelper local_1f8;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar;
  AssertHelper local_1c0;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> select_utxos;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> utxos;
  Amount local_178;
  Amount fee;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  map_searched_bnb;
  AmountMap map_select_value;
  CoinSelectionOption option_params;
  AmountMap map_target_amount;
  CoinSelection coin_select;
  
  cfd::CoinSelection::CoinSelection(&coin_select,true);
  map_target_amount._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &map_target_amount._M_t._M_impl.super__Rb_tree_header._M_header;
  map_target_amount._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  map_target_amount._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  map_target_amount._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  map_target_amount._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       map_target_amount._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)&option_params,&exp_dummy_asset_a);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
           ::operator[](&map_target_amount,(key_type *)&option_params);
  *pmVar4 = 0x6cc1cc0;
  std::__cxx11::string::~string((string *)&option_params);
  map_select_value._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &map_select_value._M_t._M_impl.super__Rb_tree_header._M_header;
  map_select_value._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  map_select_value._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  map_select_value._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  map_select_value._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       map_select_value._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  cfd::core::Amount::Amount(&fee);
  AVar7 = cfd::core::Amount::CreateBySatoshiAmount(0x5dc);
  local_178.amount_ = AVar7.amount_;
  map_searched_bnb._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &map_searched_bnb._M_t._M_impl.super__Rb_tree_header._M_header;
  map_searched_bnb._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  map_searched_bnb._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  map_searched_bnb._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_178.ignore_check_ = AVar7.ignore_check_;
  utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  map_searched_bnb._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       map_searched_bnb._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::resize
            (&utxos,((long)kExtCoinSelectElementsTestVector.
                           super__Vector_base<TestElementsUtxoCoinVector,_std::allocator<TestElementsUtxoCoinVector>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)kExtCoinSelectElementsTestVector.
                          super__Vector_base<TestElementsUtxoCoinVector,_std::allocator<TestElementsUtxoCoinVector>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x70);
  pTVar2 = kExtCoinSelectElementsTestVector.
           super__Vector_base<TestElementsUtxoCoinVector,_std::allocator<TestElementsUtxoCoinVector>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  utxo = utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
         super__Vector_impl_data._M_start;
  for (hex = kExtCoinSelectElementsTestVector.
             super__Vector_base<TestElementsUtxoCoinVector,_std::allocator<TestElementsUtxoCoinVector>_>
             ._M_impl.super__Vector_impl_data._M_start; hex != pTVar2; hex = hex + 1) {
    cfd::core::Txid::Txid((Txid *)&option_params);
    if ((hex->txid)._M_string_length != 0) {
      cfd::core::Txid::Txid((Txid *)&gtest_ar,&hex->txid);
      cfd::core::Txid::operator=((Txid *)&option_params,(Txid *)&gtest_ar);
      cfd::core::Txid::~Txid((Txid *)&gtest_ar);
    }
    vout = hex->vout;
    AVar7 = cfd::core::Amount::CreateBySatoshiAmount(hex->amount);
    gtest_ar._0_8_ = AVar7.amount_;
    gtest_ar.message_.ptr_._0_1_ = AVar7.ignore_check_;
    in_R9 = (CoinSelectionOption *)0x0;
    cfd::CoinSelection::ConvertToUtxo
              ((Txid *)&option_params,vout,&hex->descriptor,(Amount *)&gtest_ar,&hex->asset,
               (void *)0x0,utxo,(Script *)0x0);
    utxo = utxo + 1;
    cfd::core::Txid::~Txid((Txid *)&option_params);
  }
  cfd::CoinSelectionOption::CoinSelectionOption(&option_params);
  cfd::CoinSelectionOption::InitializeConfidentialTxSizeInfo(&option_params);
  cfd::CoinSelectionOption::SetEffectiveFeeBaserate(&option_params,1.0);
  cfd::CoinSelectionOption::SetFeeAsset(&option_params,&exp_dummy_asset_a);
  select_utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  select_utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  select_utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      in_R9 = &option_params;
      cfd::CoinSelection::SelectCoins
                ((vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)&gtest_ar,&coin_select,
                 &map_target_amount,&utxos,&exp_filter,in_R9,&local_178,&map_select_value,&fee,
                 &map_searched_bnb,(AmountMap *)0x0);
      std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::_M_move_assign(&select_utxos,&gtest_ar);
      std::_Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>::~_Vector_base
                ((_Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)&gtest_ar);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x4a3,
               "Expected: (select_utxos = coin_select.SelectCoins(map_target_amount, utxos, exp_filter, option_params, tx_fee, &map_select_value, &fee, &map_searched_bnb)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  gtest_ar_5._0_8_ =
       ((long)select_utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
              super__Vector_impl_data._M_finish -
       (long)select_utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
             super__Vector_impl_data._M_start) / 0xd8;
  local_1f8.data_._0_4_ = 3;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&gtest_ar,"select_utxos.size()","3",(unsigned_long *)&gtest_ar_5,
             (int *)&local_1f8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_5);
    if ((undefined8 *)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_) ==
        (undefined8 *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x4a4,pcVar6);
    testing::internal::AssertHelper::operator=(&local_1f8,(Message *)&gtest_ar_5);
    testing::internal::AssertHelper::~AssertHelper(&local_1f8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_5);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  if ((long)select_utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)select_utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
            super__Vector_impl_data._M_start == 0x288) {
    gtest_ar_5.success_ = true;
    gtest_ar_5._1_7_ = 0x3a3bd;
    testing::internal::CmpHelperEQ<unsigned_long,long>
              ((internal *)&gtest_ar,"select_utxos[0].amount","static_cast<int64_t>(61062500)",
               &(select_utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
                 super__Vector_impl_data._M_start)->amount,(long *)&gtest_ar_5);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_5);
      if ((undefined8 *)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_) ==
          (undefined8 *)0x0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = *(char **)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_);
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_1f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
                 ,0x4a6,pcVar6);
      testing::internal::AssertHelper::operator=(&local_1f8,(Message *)&gtest_ar_5);
      testing::internal::AssertHelper::~AssertHelper(&local_1f8);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_5);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    gtest_ar_5.success_ = true;
    gtest_ar_5._1_7_ = 0x2540b;
    testing::internal::CmpHelperEQ<unsigned_long,long>
              ((internal *)&gtest_ar,"select_utxos[1].amount","static_cast<int64_t>(39062500)",
               &select_utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
                super__Vector_impl_data._M_start[1].amount,(long *)&gtest_ar_5);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_5);
      if ((undefined8 *)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_) ==
          (undefined8 *)0x0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = *(char **)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_);
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_1f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
                 ,0x4a7,pcVar6);
      testing::internal::AssertHelper::operator=(&local_1f8,(Message *)&gtest_ar_5);
      testing::internal::AssertHelper::~AssertHelper(&local_1f8);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_5);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    gtest_ar_5.success_ = true;
    gtest_ar_5._1_7_ = 0xe3f1;
    testing::internal::CmpHelperEQ<unsigned_long,long>
              ((internal *)&gtest_ar,"select_utxos[2].amount","static_cast<int64_t>(14938590)",
               &select_utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
                super__Vector_impl_data._M_start[2].amount,(long *)&gtest_ar_5);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_5);
      if ((undefined8 *)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_) ==
          (undefined8 *)0x0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = *(char **)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_);
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_1f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
                 ,0x4a8,pcVar6);
      testing::internal::AssertHelper::operator=(&local_1f8,(Message *)&gtest_ar_5);
      testing::internal::AssertHelper::~AssertHelper(&local_1f8);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_5);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
  }
  gtest_ar_5._0_8_ = map_select_value._M_t._M_impl.super__Rb_tree_header._M_node_count;
  local_1f8.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&gtest_ar,"map_select_value.size()","1",(unsigned_long *)&gtest_ar_5,
             (int *)&local_1f8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_5);
    if ((undefined8 *)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_) ==
        (undefined8 *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x4aa,pcVar6);
    testing::internal::AssertHelper::operator=(&local_1f8,(Message *)&gtest_ar_5);
    testing::internal::AssertHelper::~AssertHelper(&local_1f8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_5);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  if (map_select_value._M_t._M_impl.super__Rb_tree_header._M_node_count == 1) {
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)&gtest_ar,&exp_dummy_asset_a);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
             ::operator[](&map_select_value,(key_type *)&gtest_ar);
    local_1f8.data_._0_4_ = 0x6dbbb26;
    testing::internal::CmpHelperEQ<long,int>
              ((internal *)&gtest_ar_5,"map_select_value[exp_dummy_asset_a.GetHex()]","115063590",
               pmVar4,(int *)&local_1f8);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if (gtest_ar_5.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar);
      if (gtest_ar_5.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = ((gtest_ar_5.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_1f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
                 ,0x4ac,pcVar6);
      testing::internal::AssertHelper::operator=(&local_1f8,(Message *)&gtest_ar);
      testing::internal::AssertHelper::~AssertHelper(&local_1f8);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_5.message_);
  }
  gtest_ar_5._0_8_ = cfd::core::Amount::GetSatoshiValue(&fee);
  local_1f8.data_._0_4_ = 0x114;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&gtest_ar,"fee.GetSatoshiValue()","276",(long *)&gtest_ar_5,
             (int *)&local_1f8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_5);
    if ((undefined8 *)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_) ==
        (undefined8 *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x4ae,pcVar6);
    testing::internal::AssertHelper::operator=(&local_1f8,(Message *)&gtest_ar_5);
    testing::internal::AssertHelper::~AssertHelper(&local_1f8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_5);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_5._0_8_ = map_searched_bnb._M_t._M_impl.super__Rb_tree_header._M_node_count;
  local_1f8.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&gtest_ar,"map_searched_bnb.size()","1",(unsigned_long *)&gtest_ar_5,
             (int *)&local_1f8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_5);
    if ((undefined8 *)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_) ==
        (undefined8 *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x4af,pcVar6);
    testing::internal::AssertHelper::operator=(&local_1f8,(Message *)&gtest_ar_5);
    testing::internal::AssertHelper::~AssertHelper(&local_1f8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_5);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  if (map_searched_bnb._M_t._M_impl.super__Rb_tree_header._M_node_count == 1) {
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)&gtest_ar,&exp_dummy_asset_a);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
             ::operator[](&map_searched_bnb,(key_type *)&gtest_ar);
    mVar1 = *pmVar5;
    gtest_ar_5._0_8_ = CONCAT71(gtest_ar_5._1_7_,mVar1) ^ 1;
    gtest_ar_5.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    std::__cxx11::string::~string((string *)&gtest_ar);
    if (mVar1 != false) {
      testing::Message::Message((Message *)&local_1f8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar,(internal *)&gtest_ar_5,
                 (AssertionResult *)"map_searched_bnb[exp_dummy_asset_a.GetHex()]","true","false",
                 &in_R9->use_bnb_);
      testing::internal::AssertHelper::AssertHelper
                (&local_1c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
                 ,0x4b1,(char *)gtest_ar._0_8_);
      testing::internal::AssertHelper::operator=(&local_1c0,(Message *)&local_1f8);
      testing::internal::AssertHelper::~AssertHelper(&local_1c0);
      std::__cxx11::string::~string((string *)&gtest_ar);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_1f8);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_5.message_);
  }
  std::_Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>::~_Vector_base
            (&select_utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId(&option_params.fee_asset_);
  std::_Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>::~_Vector_base
            (&utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::~_Rb_tree(&map_searched_bnb._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
  ::~_Rb_tree(&map_select_value._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
  ::~_Rb_tree(&map_target_amount._M_t);
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            (&coin_select.randomize_cache_.super__Bvector_base<std::allocator<bool>_>);
  return;
}

Assistant:

TEST(CoinSelection, SelectCoins_SelectCoinsBnB_empty_with_asset)
{
  CoinSelection coin_select(true);
  AmountMap map_target_amount;
  map_target_amount[exp_dummy_asset_a.GetHex()] = 114040000;
  AmountMap map_select_value;
  Amount fee;
  Amount tx_fee = Amount::CreateBySatoshiAmount(1500);
  std::map<std::string, bool> map_searched_bnb;

  std::vector<Utxo> utxos;
  utxos.resize(kExtCoinSelectElementsTestVector.size());
  std::vector<Utxo>::iterator ite = utxos.begin();
  for (const auto& test_data : kExtCoinSelectElementsTestVector) {
    Txid txid;
    if (!test_data.txid.empty()) {
      txid = Txid(test_data.txid);
    }
    CoinSelection::ConvertToUtxo(
        txid, test_data.vout, test_data.descriptor,
        Amount::CreateBySatoshiAmount(test_data.amount), test_data.asset,
        nullptr, &(*ite));
    ++ite;
  }

  CoinSelectionOption option_params;
  option_params.InitializeConfidentialTxSizeInfo();
  option_params.SetEffectiveFeeBaserate(1);
  option_params.SetFeeAsset(exp_dummy_asset_a);

  std::vector<Utxo> select_utxos;
  EXPECT_NO_THROW((select_utxos = coin_select.SelectCoins(map_target_amount, utxos,
      exp_filter, option_params, tx_fee, &map_select_value, &fee, &map_searched_bnb)));
  EXPECT_EQ(select_utxos.size(), 3);
  if (select_utxos.size() == 3) {
    EXPECT_EQ(select_utxos[0].amount, static_cast<int64_t>(61062500));
    EXPECT_EQ(select_utxos[1].amount, static_cast<int64_t>(39062500));
    EXPECT_EQ(select_utxos[2].amount, static_cast<int64_t>(14938590));
  }
  EXPECT_EQ(map_select_value.size(), 1);
  if (map_select_value.size() == 1) {
    EXPECT_EQ(map_select_value[exp_dummy_asset_a.GetHex()], 115063590);
  }
  EXPECT_EQ(fee.GetSatoshiValue(), 276);
  EXPECT_EQ(map_searched_bnb.size(), 1);
  if (map_searched_bnb.size() == 1) {
    EXPECT_FALSE(map_searched_bnb[exp_dummy_asset_a.GetHex()]);
  }
}